

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

int Str_MuxRestructArea_rec
              (Gia_Man_t *pNew,Str_Mux_t *pTree,Str_Mux_t *pRoot,int i,Vec_Int_t *vDelay,
              int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Str_Mux_t *pMux;
  Str_Mux_t *pRoot_00;
  long lVar4;
  int Path [4];
  
  lVar4 = (long)pRoot->Edge[i].Fan;
  if (0 < lVar4) {
    pRoot_00 = pRoot + (lVar4 - pRoot->Id);
    iVar1 = Str_MuxRestructArea_rec(pNew,pTree,pRoot_00,0,vDelay,fVerbose);
    iVar2 = Str_MuxRestructArea_rec(pNew,pTree,pRoot_00,1,vDelay,fVerbose);
    iVar3 = iVar2 + iVar1;
    if (iVar3 < 2) {
      return iVar3 + 1;
    }
    if (iVar3 - 3U < 2) {
      iVar3 = CONCAT31((int3)(iVar3 - 3U >> 8),iVar2 == 2 || iVar1 == 2);
      if (iVar2 != 2 && iVar1 != 2) {
        __assert_fail("nMuxes0 == 2 || nMuxes1 == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x714,
                      "int Str_MuxRestructArea_rec(Gia_Man_t *, Str_Mux_t *, Str_Mux_t *, int, Vec_Int_t *, int)"
                     );
      }
    }
    else {
      if (iVar3 != 2) {
        __assert_fail("nMuxes0 + nMuxes1 == 3 || nMuxes0 + nMuxes1 == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x713,
                      "int Str_MuxRestructArea_rec(Gia_Man_t *, Str_Mux_t *, Str_Mux_t *, int, Vec_Int_t *, int)"
                     );
      }
      if (iVar1 == 2 || iVar2 == 2) {
        pMux = pRoot_00 + ((long)pRoot_00->Edge[iVar2 == 2].Fan - (long)pRoot_00->Id);
        iVar3 = Str_MuxHasFanin(pMux,0);
        iVar1 = Str_MuxHasFanin(pMux,1);
        if (iVar3 == iVar1) {
          __assert_fail("Str_MuxHasFanin(pFanin0, 0) != Str_MuxHasFanin(pFanin0, 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                        ,0x70a,
                        "int Str_MuxRestructArea_rec(Gia_Man_t *, Str_Mux_t *, Str_Mux_t *, int, Vec_Int_t *, int)"
                       );
        }
        Path[2] = Abc_Var2Lit(pRoot->Id,i);
        Path[1] = Abc_Var2Lit(pRoot_00->Id,(uint)(iVar2 == 2));
        iVar3 = pMux->Id;
        iVar1 = Str_MuxHasFanin(pMux,1);
        Path[0] = Abc_Var2Lit(iVar3,iVar1);
        Str_MuxChangeOnce(pTree,Path,0,2,(Str_Mux_t *)0x0,pNew,vDelay);
      }
      iVar3 = pRoot->Id * 0x40;
      pRoot_00 = pRoot + ((long)pRoot->Edge[i].Fan - (long)pRoot->Id);
    }
    Str_MuxRestructAreaThree(pNew,pRoot_00,vDelay,iVar3);
  }
  return 0;
}

Assistant:

int Str_MuxRestructArea_rec( Gia_Man_t * pNew, Str_Mux_t * pTree, Str_Mux_t * pRoot, int i, Vec_Int_t * vDelay, int fVerbose )
{
    int Path[4];
    int fSkipMoving = 1;
    Str_Mux_t * pMux, * pFanin0, * pFanin1;
    int nMuxes0, nMuxes1;
    if ( pRoot->Edge[i].Fan <= 0 )
        return 0;
    pMux    = Str_MuxFanin( pRoot, i );
    nMuxes0 = Str_MuxRestructArea_rec( pNew, pTree, pMux, 0, vDelay, fVerbose );
    nMuxes1 = Str_MuxRestructArea_rec( pNew, pTree, pMux, 1, vDelay, fVerbose );
    if ( nMuxes0 + nMuxes1 < 2 )
        return 1 + nMuxes0 + nMuxes1;
    if ( nMuxes0 + nMuxes1 == 2 )
    {
        if ( nMuxes0 == 2 || nMuxes1 == 2 )
        {
            pFanin0 = Str_MuxFanin( pMux, (int)(nMuxes1 == 2) );
            assert( Str_MuxHasFanin(pFanin0, 0) != Str_MuxHasFanin(pFanin0, 1) );
            Path[2] = Abc_Var2Lit(pRoot->Id, i);
            Path[1] = Abc_Var2Lit(pMux->Id, (int)(nMuxes1 == 2) );
            Path[0] = Abc_Var2Lit(pFanin0->Id, Str_MuxHasFanin(pFanin0, 1));
            Str_MuxChangeOnce( pTree, Path, 0, 2, NULL, pNew, vDelay );
        }
        Str_MuxRestructAreaThree( pNew, Str_MuxFanin(pRoot, i), vDelay, fVerbose );
        return 0;
    }
    assert( nMuxes0 + nMuxes1 == 3 || nMuxes0 + nMuxes1 == 4 );
    assert( nMuxes0 == 2 || nMuxes1 == 2 );
    if ( fSkipMoving )
    {
        Str_MuxRestructAreaThree( pNew, pMux, vDelay, fVerbose );
        return 0;
    }
    if ( nMuxes0 == 2 )
    {
        pFanin0 = Str_MuxFanin( pMux, 0 );
        assert( Str_MuxHasFanin(pFanin0, 0) != Str_MuxHasFanin(pFanin0, 1) );
        Path[3] = Abc_Var2Lit(pRoot->Id, i);
        Path[2] = Abc_Var2Lit(pMux->Id, 0 );
        Path[1] = Abc_Var2Lit(pFanin0->Id, Str_MuxHasFanin(pFanin0, 1));
        pFanin1 = Str_MuxFanin( pFanin0, Str_MuxHasFanin(pFanin0, 1) );
        assert( !Str_MuxHasFanin(pFanin1, 0) && !Str_MuxHasFanin(pFanin1, 1) );
        Path[0] = Abc_Var2Lit(pFanin1->Id, 0);
        Str_MuxChangeOnce( pTree, Path, 0, 3, NULL, pNew, vDelay );
    }
    if ( nMuxes1 == 2 )
    {
        pFanin0 = Str_MuxFanin( pMux, 1 );
        assert( Str_MuxHasFanin(pFanin0, 0) != Str_MuxHasFanin(pFanin0, 1) );
        Path[3] = Abc_Var2Lit(pRoot->Id, i);
        Path[2] = Abc_Var2Lit(pMux->Id, 1 );
        Path[1] = Abc_Var2Lit(pFanin0->Id, Str_MuxHasFanin(pFanin0, 1));
        pFanin1 = Str_MuxFanin( pFanin0, Str_MuxHasFanin(pFanin0, 1) );
        assert( !Str_MuxHasFanin(pFanin1, 0) && !Str_MuxHasFanin(pFanin1, 1) );
        Path[0] = Abc_Var2Lit(pFanin1->Id, 0);
        Str_MuxChangeOnce( pTree, Path, 0, 3, NULL, pNew, vDelay );
    }
    Str_MuxRestructAreaThree( pNew, pMux, vDelay, fVerbose );
    return nMuxes0 + nMuxes1 - 2;
}